

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O0

WeierstrassPoint * ecc_weierstrass_multiply(WeierstrassPoint *B,mp_int *n)

{
  uint swap;
  WeierstrassPoint *orig;
  WeierstrassPoint *Q;
  WeierstrassPoint *P;
  WeierstrassPoint *other;
  WeierstrassPoint *sum;
  size_t sStack_40;
  uint nbit;
  size_t bitindex;
  WeierstrassPoint *pWStack_30;
  uint not_started_yet;
  WeierstrassPoint *kplus1_B;
  WeierstrassPoint *k_B;
  WeierstrassPoint *two_B;
  mp_int *n_local;
  WeierstrassPoint *B_local;
  
  orig = ecc_weierstrass_double(B);
  kplus1_B = ecc_weierstrass_point_copy(B);
  pWStack_30 = ecc_weierstrass_point_copy(orig);
  bitindex._4_4_ = 1;
  sStack_40 = mp_max_bits(n);
  while (sStack_40 != 0) {
    swap = mp_get_bit(n,sStack_40 - 1);
    Q = ecc_weierstrass_add(kplus1_B,pWStack_30);
    ecc_weierstrass_cond_swap(kplus1_B,pWStack_30,swap);
    P = ecc_weierstrass_double(kplus1_B);
    ecc_weierstrass_point_free(kplus1_B);
    ecc_weierstrass_point_free(pWStack_30);
    ecc_weierstrass_cond_swap(P,Q,swap);
    ecc_weierstrass_cond_overwrite(P,B,bitindex._4_4_);
    ecc_weierstrass_cond_overwrite(Q,orig,bitindex._4_4_);
    bitindex._4_4_ = (swap ^ 0xffffffff) & bitindex._4_4_;
    sStack_40 = sStack_40 - 1;
    pWStack_30 = Q;
    kplus1_B = P;
  }
  ecc_weierstrass_point_free(orig);
  ecc_weierstrass_point_free(pWStack_30);
  return kplus1_B;
}

Assistant:

WeierstrassPoint *ecc_weierstrass_multiply(WeierstrassPoint *B, mp_int *n)
{
    WeierstrassPoint *two_B = ecc_weierstrass_double(B);
    WeierstrassPoint *k_B = ecc_weierstrass_point_copy(B);
    WeierstrassPoint *kplus1_B = ecc_weierstrass_point_copy(two_B);

    /*
     * This multiply routine more or less follows the shape of the
     * 'Montgomery ladder' technique that you have to use under the
     * extra constraint on addition in Montgomery curves, because it
     * was fresh in my mind and easier to just do it the same way. See
     * the comment in ecc_montgomery_multiply.
     */

    unsigned not_started_yet = 1;
    for (size_t bitindex = mp_max_bits(n); bitindex-- > 0 ;) {
        unsigned nbit = mp_get_bit(n, bitindex);

        WeierstrassPoint *sum = ecc_weierstrass_add(k_B, kplus1_B);
        ecc_weierstrass_cond_swap(k_B, kplus1_B, nbit);
        WeierstrassPoint *other = ecc_weierstrass_double(k_B);
        ecc_weierstrass_point_free(k_B);
        ecc_weierstrass_point_free(kplus1_B);
        k_B = other;
        kplus1_B = sum;
        ecc_weierstrass_cond_swap(k_B, kplus1_B, nbit);

        ecc_weierstrass_cond_overwrite(k_B, B, not_started_yet);
        ecc_weierstrass_cond_overwrite(kplus1_B, two_B, not_started_yet);
        not_started_yet &= ~nbit;
    }

    ecc_weierstrass_point_free(two_B);
    ecc_weierstrass_point_free(kplus1_B);
    return k_B;
}